

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

int __thiscall
ncnn::NetPrivate::do_forward_layer
          (NetPrivate *this,Layer *layer,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *blob_mats,
          Option *opt)

{
  bool *pbVar1;
  pointer pMVar2;
  undefined8 *puVar3;
  int iVar4;
  int iVar5;
  pointer piVar6;
  Allocator *pAVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  int iVar15;
  int *piVar16;
  ulong uVar17;
  ulong uVar18;
  NetPrivate *this_00;
  NetPrivate *pNVar19;
  NetPrivate *pNVar20;
  void *in_R8;
  size_t i;
  pointer pMVar21;
  long lVar22;
  pointer pMVar23;
  size_t i_2;
  bool bVar24;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> top_blobs;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blobs;
  allocator_type local_c9;
  undefined1 local_c8 [80];
  pointer local_78;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  int local_60;
  Allocator *local_58;
  int iStack_50;
  int iStack_4c;
  int iStack_48;
  int iStack_44;
  int local_40;
  pointer local_38;
  
  if (layer->one_blob_only != true) {
    this_00 = (NetPrivate *)&stack0xffffffffffffff88;
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)this_00,
               (long)(layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2,(allocator_type *)local_c8);
    lVar22 = 0;
    uVar18 = 0;
    while( true ) {
      pMVar21 = local_78;
      piVar6 = (layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar17 = (long)(layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)piVar6 >> 2;
      if (uVar17 <= uVar18) break;
      pMVar23 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start + piVar6[uVar18];
      piVar16 = *(int **)((long)&local_78->refcount + lVar22);
      if (piVar16 != (int *)0x0) {
        LOCK();
        *piVar16 = *piVar16 + -1;
        UNLOCK();
        if (*piVar16 == 0) {
          this_00 = *(NetPrivate **)((long)&local_78->data + lVar22);
          pNVar19 = *(NetPrivate **)((long)&local_78->allocator + lVar22);
          if (pNVar19 == (NetPrivate *)0x0) {
            free(this_00);
          }
          else {
            (**(code **)&((((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&pNVar19->opt)->
                          _M_impl).super__Vector_impl_data._M_start)->elempack)();
            this_00 = pNVar19;
          }
        }
      }
      pbVar1 = (bool *)((long)&pMVar21->data + lVar22);
      *(undefined8 *)((long)&pMVar21->cstep + lVar22) = 0;
      *(undefined8 *)(pbVar1 + 0xc) = 0;
      *(undefined8 *)(pbVar1 + 0x14) = 0;
      *(undefined8 *)pbVar1 = 0;
      *(Allocator **)(pbVar1 + 8) = (Allocator *)0x0;
      *(undefined4 *)((long)&pMVar21->c + lVar22) = 0;
      *(undefined8 *)((long)&pMVar21->dims + lVar22) = 0;
      *(undefined8 *)((bool *)((long)&pMVar21->dims + lVar22) + 8) = 0;
      if (((opt->lightmode == true) && (layer->support_inplace == true)) &&
         (*pMVar23->refcount != 1)) {
        this_00 = (NetPrivate *)local_c8;
        Mat::clone((Mat *)local_c8,(__fn *)pMVar23,opt->blob_allocator,(int)uVar17,opt);
        pMVar21 = local_78;
        pNVar19 = (NetPrivate *)((long)&local_78->data + lVar22);
        piVar16 = (int *)CONCAT44(local_c8._12_4_,local_c8._8_4_);
        if (pNVar19 != (NetPrivate *)local_c8) {
          if (piVar16 != (int *)0x0) {
            LOCK();
            *piVar16 = *piVar16 + 1;
            UNLOCK();
          }
          piVar16 = *(int **)((long)&local_78->refcount + lVar22);
          if (piVar16 != (int *)0x0) {
            LOCK();
            *piVar16 = *piVar16 + -1;
            UNLOCK();
            if (*piVar16 == 0) {
              this_00 = *(NetPrivate **)((long)&local_78->data + lVar22);
              pNVar20 = *(NetPrivate **)((long)&local_78->allocator + lVar22);
              if (pNVar20 == (NetPrivate *)0x0) {
                free(this_00);
              }
              else {
                (**(code **)&((((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&pNVar20->opt
                               )->_M_impl).super__Vector_impl_data._M_start)->elempack)();
                this_00 = pNVar20;
              }
            }
          }
          *(undefined8 *)((long)&pMVar21->cstep + lVar22) = 0;
          *(undefined8 *)
           ((long)&(pNVar19->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                   _M_impl.super__Vector_impl_data._M_start + 4) = 0;
          *(undefined8 *)
           ((long)&(pNVar19->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
          pNVar19->opt = (Option *)0x0;
          (pNVar19->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          *(undefined8 *)((long)&pMVar21->dims + lVar22) = 0;
          *(undefined8 *)((bool *)((long)&pMVar21->dims + lVar22) + 8) = 0;
          *(undefined4 *)((long)&pMVar21->c + lVar22) = 0;
          *(undefined8 *)((long)&pMVar21->data + lVar22) = local_c8._0_8_;
          piVar16 = (int *)CONCAT44(local_c8._12_4_,local_c8._8_4_);
          *(int **)((long)&pMVar21->refcount + lVar22) = piVar16;
          *(ulong *)((long)&pMVar21->elemsize + lVar22) = CONCAT44(local_c8._20_4_,local_c8._16_4_);
          *(undefined4 *)((long)&pMVar21->elempack + lVar22) = local_c8._24_4_;
          *(undefined8 *)((long)&pMVar21->allocator + lVar22) = local_c8._32_8_;
          pbVar1 = (bool *)((long)&pMVar21->dims + lVar22);
          *(undefined4 *)pbVar1 = local_c8._40_4_;
          *(undefined4 *)(pbVar1 + 4) = local_c8._44_4_;
          *(undefined4 *)(pbVar1 + 8) = local_c8._48_4_;
          *(undefined4 *)(pbVar1 + 0xc) = local_c8._52_4_;
          *(undefined4 *)((long)&pMVar21->c + lVar22) = local_c8._56_4_;
          *(undefined8 *)((long)&pMVar21->cstep + lVar22) = local_c8._64_8_;
        }
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + -1;
          UNLOCK();
          if (*piVar16 == 0) {
            if ((NetPrivate *)local_c8._32_8_ == (NetPrivate *)0x0) {
              this_00 = (NetPrivate *)local_c8._0_8_;
              free((void *)local_c8._0_8_);
            }
            else {
              this_00 = (NetPrivate *)local_c8._32_8_;
              (**(code **)&((((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)local_c8._32_8_
                             )->_M_impl).super__Vector_impl_data._M_start)->elempack)();
            }
          }
        }
      }
      pMVar21 = local_78;
      if ((*(int *)((long)&local_78->dims + lVar22) == 0) &&
         (pMVar2 = (pointer)((long)&local_78->data + lVar22), pMVar2 != pMVar23)) {
        piVar16 = pMVar23->refcount;
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + 1;
          UNLOCK();
        }
        piVar16 = *(int **)((long)&local_78->refcount + lVar22);
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + -1;
          UNLOCK();
          if (*piVar16 == 0) {
            this_00 = *(NetPrivate **)((long)&local_78->data + lVar22);
            pNVar19 = *(NetPrivate **)((long)&local_78->allocator + lVar22);
            if (pNVar19 == (NetPrivate *)0x0) {
              free(this_00);
            }
            else {
              (**(code **)&((((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&pNVar19->opt)
                            ->_M_impl).super__Vector_impl_data._M_start)->elempack)();
              this_00 = pNVar19;
            }
          }
        }
        pbVar1 = (bool *)((long)&pMVar21->data + lVar22);
        *(undefined8 *)(pbVar1 + 0x40) = 0;
        *(undefined8 *)((long)&pMVar2->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar2->elemsize + 4) = 0;
        pMVar2->data = (void *)0x0;
        pMVar2->refcount = (int *)0x0;
        *(undefined4 *)(pbVar1 + 0x38) = 0;
        *(undefined8 *)(pbVar1 + 0x28) = 0;
        *(undefined8 *)(pbVar1 + 0x30) = 0;
        pAVar7 = (Allocator *)pMVar23->refcount;
        *(void **)pbVar1 = pMVar23->data;
        *(Allocator **)(pbVar1 + 8) = pAVar7;
        *(Allocator **)(pbVar1 + 0x10) = (Allocator *)pMVar23->elemsize;
        *(int *)(pbVar1 + 0x18) = pMVar23->elempack;
        *(Allocator **)(pbVar1 + 0x20) = pMVar23->allocator;
        uVar8 = *(undefined8 *)&pMVar23->h;
        *(undefined8 *)(pbVar1 + 0x28) = *(undefined8 *)&pMVar23->dims;
        *(undefined8 *)(pbVar1 + 0x30) = uVar8;
        *(int *)(pbVar1 + 0x38) = pMVar23->c;
        *(size_t *)(pbVar1 + 0x40) = pMVar23->cstep;
      }
      convert_layout(this_00,(Mat *)((long)&local_78->data + lVar22),layer,opt);
      uVar18 = uVar18 + 1;
      lVar22 = lVar22 + 0x48;
    }
    if ((opt->lightmode == false) || (layer->support_inplace != true)) {
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)local_c8,
                 (long)(layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2,&local_c9);
      iVar15 = (*layer->_vptr_Layer[6])(layer,&stack0xffffffffffffff88,local_c8,opt);
      if (iVar15 == 0) {
        lVar22 = 0;
        for (uVar18 = 0; uVar8 = local_c8._0_8_,
            piVar6 = (layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
            uVar18 < (ulong)((long)(layer->tops).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)piVar6 >> 2);
            uVar18 = uVar18 + 1) {
          pMVar21 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start + piVar6[uVar18];
          if ((pointer)((long)&(((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                                local_c8._0_8_)->_M_impl).super__Vector_impl_data._M_start + lVar22)
              != pMVar21) {
            piVar16 = *(int **)((long)&(((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                        (local_c8._0_8_ + 8))->
                                       super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                                       _M_impl.super__Vector_impl_data._M_start + lVar22);
            if (piVar16 != (int *)0x0) {
              LOCK();
              *piVar16 = *piVar16 + 1;
              UNLOCK();
            }
            piVar16 = pMVar21->refcount;
            if (piVar16 != (int *)0x0) {
              LOCK();
              *piVar16 = *piVar16 + -1;
              UNLOCK();
              if (*piVar16 == 0) {
                if (pMVar21->allocator == (Allocator *)0x0) {
                  free(pMVar21->data);
                }
                else {
                  (*pMVar21->allocator->_vptr_Allocator[3])();
                }
              }
            }
            pMVar21->cstep = 0;
            pMVar21->data = (void *)0x0;
            pMVar21->refcount = (int *)0x0;
            *(undefined8 *)((long)&pMVar21->refcount + 4) = 0;
            *(undefined8 *)((long)&pMVar21->elemsize + 4) = 0;
            pMVar21->c = 0;
            pMVar21->dims = 0;
            pMVar21->w = 0;
            pMVar21->h = 0;
            pMVar21->d = 0;
            puVar3 = (undefined8 *)
                     ((long)&(((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)uVar8)->
                             _M_impl).super__Vector_impl_data._M_start + lVar22);
            piVar16 = (int *)puVar3[1];
            pMVar21->data = (void *)*puVar3;
            pMVar21->refcount = piVar16;
            pMVar21->elemsize =
                 *(size_t *)
                  ((long)&(((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)(uVar8 + 8))->
                          super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
                          super__Vector_impl_data._M_finish + lVar22);
            pMVar21->elempack =
                 *(int *)((long)&(((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)(uVar8 + 8))->
                                 super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + lVar22);
            pMVar21->allocator =
                 *(Allocator **)
                  ((long)&(((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(uVar8 + 0x20))
                          ->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                          _M_impl.super__Vector_impl_data._M_start + lVar22);
            puVar3 = (undefined8 *)
                     ((long)&(((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                              (uVar8 + 0x20))->
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                             _M_impl.super__Vector_impl_data._M_finish + lVar22);
            uVar9 = *puVar3;
            uVar10 = puVar3[1];
            pMVar21->dims = (int)uVar9;
            pMVar21->w = (int)((ulong)uVar9 >> 0x20);
            pMVar21->h = (int)uVar10;
            pMVar21->d = (int)((ulong)uVar10 >> 0x20);
            pMVar21->c = *(int *)((long)&(((vector<int,_std::allocator<int>_> *)(uVar8 + 0x38))->
                                         super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                         super__Vector_impl_data._M_start + lVar22);
            pMVar21->cstep =
                 *(size_t *)
                  ((long)&(((vector<int,_std::allocator<int>_> *)(uVar8 + 0x38))->
                          super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish + lVar22);
          }
          lVar22 = lVar22 + 0x48;
        }
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                  ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)local_c8);
        goto LAB_00168a55;
      }
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)local_c8);
LAB_0016894a:
      bVar24 = false;
    }
    else {
      iVar15 = (*layer->_vptr_Layer[8])(layer,&stack0xffffffffffffff88,opt);
      if (iVar15 != 0) goto LAB_0016894a;
      lVar22 = 0;
      for (uVar18 = 0; pMVar21 = local_78,
          piVar6 = (layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
          uVar18 < (ulong)((long)(layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl
                                 .super__Vector_impl_data._M_finish - (long)piVar6 >> 2);
          uVar18 = uVar18 + 1) {
        pMVar23 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start + piVar6[uVar18];
        if ((pointer)((long)&local_78->data + lVar22) != pMVar23) {
          piVar16 = *(int **)((long)&local_78->refcount + lVar22);
          if (piVar16 != (int *)0x0) {
            LOCK();
            *piVar16 = *piVar16 + 1;
            UNLOCK();
          }
          piVar16 = pMVar23->refcount;
          if (piVar16 != (int *)0x0) {
            LOCK();
            *piVar16 = *piVar16 + -1;
            UNLOCK();
            if (*piVar16 == 0) {
              if (pMVar23->allocator == (Allocator *)0x0) {
                free(pMVar23->data);
              }
              else {
                (*pMVar23->allocator->_vptr_Allocator[3])();
              }
            }
          }
          pMVar23->cstep = 0;
          pMVar23->data = (void *)0x0;
          pMVar23->refcount = (int *)0x0;
          *(undefined8 *)((long)&pMVar23->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar23->elemsize + 4) = 0;
          pMVar23->c = 0;
          pMVar23->dims = 0;
          pMVar23->w = 0;
          pMVar23->h = 0;
          pMVar23->d = 0;
          pbVar1 = (bool *)((long)&pMVar21->data + lVar22);
          pAVar7 = *(Allocator **)(pbVar1 + 8);
          pMVar23->data = *(void **)pbVar1;
          pMVar23->refcount = (int *)pAVar7;
          pMVar23->elemsize = *(size_t *)((long)&pMVar21->elemsize + lVar22);
          pMVar23->elempack = *(int *)((long)&pMVar21->elempack + lVar22);
          pMVar23->allocator = *(Allocator **)((long)&pMVar21->allocator + lVar22);
          pbVar1 = (bool *)((long)&pMVar21->dims + lVar22);
          iVar15 = *(int *)(pbVar1 + 4);
          iVar4 = *(int *)(pbVar1 + 8);
          iVar5 = *(int *)(pbVar1 + 0xc);
          pMVar23->dims = *(int *)pbVar1;
          pMVar23->w = iVar15;
          pMVar23->h = iVar4;
          pMVar23->d = iVar5;
          pMVar23->c = *(int *)((long)&pMVar21->c + lVar22);
          pMVar23->cstep = *(size_t *)((long)&pMVar21->cstep + lVar22);
        }
        lVar22 = lVar22 + 0x48;
      }
LAB_00168a55:
      iVar15 = 0;
      bVar24 = true;
      if (opt->lightmode == true) {
        iVar15 = 0;
        for (uVar18 = 0;
            piVar6 = (layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
            uVar18 < (ulong)((long)(layer->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)piVar6 >> 2);
            uVar18 = uVar18 + 1) {
          iVar4 = piVar6[uVar18];
          pMVar23 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          pMVar21 = pMVar23 + iVar4;
          piVar16 = pMVar23[iVar4].refcount;
          if (piVar16 != (int *)0x0) {
            LOCK();
            *piVar16 = *piVar16 + -1;
            UNLOCK();
            if (*piVar16 == 0) {
              if (pMVar21->allocator == (Allocator *)0x0) {
                free(pMVar21->data);
              }
              else {
                (*pMVar21->allocator->_vptr_Allocator[3])();
              }
            }
          }
          pMVar21->cstep = 0;
          pMVar21->data = (void *)0x0;
          pMVar21->refcount = (int *)0x0;
          *(undefined8 *)((long)&pMVar21->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar21->elemsize + 4) = 0;
          pMVar21->dims = 0;
          pMVar21->w = 0;
          pMVar21->h = 0;
          pMVar21->d = 0;
          pMVar21->c = 0;
        }
      }
    }
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&stack0xffffffffffffff88);
    goto LAB_00168f65;
  }
  piVar16 = (layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar4 = *(layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar5 = *piVar16;
  local_c8._64_8_ = (pointer)0x0;
  pMVar21 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start + iVar4;
  local_c8._0_8_ = (pointer)0x0;
  local_c8._8_4_ = 0;
  local_c8._12_4_ = 0;
  local_c8._16_4_ = 0;
  local_c8._20_4_ = 0;
  local_c8._24_4_ = 0;
  local_c8._32_8_ = (Allocator *)0x0;
  local_c8._40_4_ = 0;
  local_c8._44_4_ = 0;
  local_c8._48_4_ = 0;
  local_c8._52_4_ = 0;
  local_c8._56_4_ = 0;
  if (((opt->lightmode == true) && (layer->support_inplace == true)) && (*pMVar21->refcount != 1)) {
    Mat::clone((Mat *)&stack0xffffffffffffff88,(__fn *)pMVar21,opt->blob_allocator,(int)piVar16,
               in_R8);
    piVar16 = (int *)CONCAT44(uStack_6c,uStack_70);
    if (piVar16 != (int *)0x0) {
      LOCK();
      *piVar16 = *piVar16 + 1;
      UNLOCK();
    }
    piVar16 = (int *)CONCAT44(local_c8._12_4_,local_c8._8_4_);
    if (piVar16 != (int *)0x0) {
      LOCK();
      *piVar16 = *piVar16 + -1;
      UNLOCK();
      if (*piVar16 == 0) {
        if ((Allocator *)local_c8._32_8_ == (Allocator *)0x0) {
          free((void *)local_c8._0_8_);
        }
        else {
          (*(*(_func_int ***)local_c8._32_8_)[3])();
        }
      }
    }
    piVar16 = (int *)CONCAT44(uStack_6c,uStack_70);
    local_c8._0_8_ = local_78;
    local_c8._8_4_ = uStack_70;
    local_c8._12_4_ = uStack_6c;
    local_c8._16_4_ = local_68;
    local_c8._20_4_ = uStack_64;
    local_c8._24_4_ = local_60;
    local_c8._32_8_ = local_58;
    local_c8._40_4_ = iStack_50;
    local_c8._44_4_ = iStack_4c;
    local_c8._48_4_ = iStack_48;
    local_c8._52_4_ = iStack_44;
    local_c8._56_4_ = local_40;
    local_c8._64_8_ = local_38;
    if (piVar16 != (int *)0x0) {
      LOCK();
      *piVar16 = *piVar16 + -1;
      UNLOCK();
      if (*piVar16 == 0) {
        if (local_58 == (Allocator *)0x0) {
          free(local_78);
        }
        else {
          (*local_58->_vptr_Allocator[3])();
        }
      }
    }
    bVar24 = local_c8._40_4_ != 0;
  }
  else {
    bVar24 = false;
  }
  if ((!bVar24) && ((pointer)local_c8 != pMVar21)) {
    piVar16 = pMVar21->refcount;
    if (piVar16 != (int *)0x0) {
      LOCK();
      *piVar16 = *piVar16 + 1;
      UNLOCK();
    }
    piVar16 = (int *)CONCAT44(local_c8._12_4_,local_c8._8_4_);
    if (piVar16 != (int *)0x0) {
      LOCK();
      *piVar16 = *piVar16 + -1;
      UNLOCK();
      if (*piVar16 == 0) {
        if ((Allocator *)local_c8._32_8_ == (Allocator *)0x0) {
          free((void *)local_c8._0_8_);
        }
        else {
          (*(*(_func_int ***)local_c8._32_8_)[3])();
        }
      }
    }
    local_c8._0_8_ = pMVar21->data;
    local_c8._8_4_ = SUB84(pMVar21->refcount,0);
    local_c8._12_4_ = (undefined4)((ulong)pMVar21->refcount >> 0x20);
    local_c8._16_4_ = (undefined4)pMVar21->elemsize;
    local_c8._20_4_ = (undefined4)(pMVar21->elemsize >> 0x20);
    local_c8._24_4_ = pMVar21->elempack;
    local_c8._32_8_ = pMVar21->allocator;
    uVar11 = pMVar21->dims;
    uVar12 = pMVar21->w;
    uVar13 = pMVar21->h;
    uVar14 = pMVar21->d;
    local_c8._56_4_ = pMVar21->c;
    local_c8._64_8_ = pMVar21->cstep;
    local_c8._40_4_ = uVar11;
    local_c8._44_4_ = uVar12;
    local_c8._48_4_ = uVar13;
    local_c8._52_4_ = uVar14;
  }
  convert_layout((NetPrivate *)opt,(Mat *)local_c8,layer,opt);
  if ((opt->lightmode == true) && (layer->support_inplace == true)) {
    iVar15 = (*layer->_vptr_Layer[9])(layer,(pointer)local_c8,opt);
    if (iVar15 != 0) goto LAB_00168d04;
    pMVar21 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start + iVar5;
    if (pMVar21 != (pointer)local_c8) {
      piVar16 = (int *)CONCAT44(local_c8._12_4_,local_c8._8_4_);
      if (piVar16 != (int *)0x0) {
        LOCK();
        *piVar16 = *piVar16 + 1;
        UNLOCK();
      }
      piVar16 = pMVar21->refcount;
      if (piVar16 != (int *)0x0) {
        LOCK();
        *piVar16 = *piVar16 + -1;
        UNLOCK();
        if (*piVar16 == 0) {
          if (pMVar21->allocator == (Allocator *)0x0) {
            free(pMVar21->data);
          }
          else {
            (*pMVar21->allocator->_vptr_Allocator[3])();
          }
        }
      }
      pMVar21->cstep = 0;
      pMVar21->data = (void *)0x0;
      pMVar21->refcount = (int *)0x0;
      *(undefined8 *)((long)&pMVar21->refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar21->elemsize + 4) = 0;
      pMVar21->c = 0;
      pMVar21->dims = 0;
      pMVar21->w = 0;
      pMVar21->h = 0;
      pMVar21->d = 0;
      pMVar21->data = (void *)local_c8._0_8_;
      pMVar21->refcount = (int *)CONCAT44(local_c8._12_4_,local_c8._8_4_);
      pMVar21->elemsize = CONCAT44(local_c8._20_4_,local_c8._16_4_);
      pMVar21->elempack = local_c8._24_4_;
      pMVar21->allocator = (Allocator *)local_c8._32_8_;
      pMVar21->dims = local_c8._40_4_;
      pMVar21->w = local_c8._44_4_;
      pMVar21->h = local_c8._48_4_;
      pMVar21->d = local_c8._52_4_;
      pMVar21->c = local_c8._56_4_;
      pMVar21->cstep = local_c8._64_8_;
    }
LAB_00168ee0:
    iVar15 = 0;
    bVar24 = true;
    if (opt->lightmode == true) {
      pMVar23 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pMVar21 = pMVar23 + iVar4;
      piVar16 = pMVar23[iVar4].refcount;
      if (piVar16 != (int *)0x0) {
        LOCK();
        *piVar16 = *piVar16 + -1;
        UNLOCK();
        if (*piVar16 == 0) {
          if (pMVar21->allocator == (Allocator *)0x0) {
            free(pMVar21->data);
          }
          else {
            (*pMVar21->allocator->_vptr_Allocator[3])();
          }
        }
      }
      pMVar21->cstep = 0;
      pMVar21->data = (void *)0x0;
      pMVar21->refcount = (int *)0x0;
      *(undefined8 *)((long)&pMVar21->refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar21->elemsize + 4) = 0;
      pMVar21->dims = 0;
      pMVar21->w = 0;
      pMVar21->h = 0;
      pMVar21->d = 0;
      pMVar21->c = 0;
    }
  }
  else {
    local_38 = (pointer)0x0;
    local_78 = (pointer)0x0;
    uStack_70 = 0;
    uStack_6c = 0;
    local_68 = 0;
    uStack_64 = 0;
    local_60 = 0;
    local_58 = (Allocator *)0x0;
    iStack_50 = 0;
    iStack_4c = 0;
    iStack_48 = 0;
    _iStack_44 = 0;
    iVar15 = (*layer->_vptr_Layer[7])(layer,local_c8,(pointer)&stack0xffffffffffffff88);
    if (iVar15 == 0) {
      pMVar21 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start + iVar5;
      piVar16 = (int *)CONCAT44(uStack_6c,uStack_70);
      if (pMVar21 != (pointer)&stack0xffffffffffffff88) {
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + 1;
          UNLOCK();
        }
        piVar16 = pMVar21->refcount;
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + -1;
          UNLOCK();
          if (*piVar16 == 0) {
            if (pMVar21->allocator == (Allocator *)0x0) {
              free(pMVar21->data);
            }
            else {
              (*pMVar21->allocator->_vptr_Allocator[3])();
            }
          }
        }
        pMVar21->cstep = 0;
        pMVar21->data = (void *)0x0;
        pMVar21->refcount = (int *)0x0;
        *(undefined8 *)((long)&pMVar21->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar21->elemsize + 4) = 0;
        pMVar21->dims = 0;
        pMVar21->w = 0;
        pMVar21->h = 0;
        pMVar21->d = 0;
        pMVar21->c = 0;
        pMVar21->data = local_78;
        piVar16 = (int *)CONCAT44(uStack_6c,uStack_70);
        pMVar21->refcount = piVar16;
        pMVar21->elemsize = CONCAT44(uStack_64,local_68);
        pMVar21->elempack = local_60;
        pMVar21->allocator = local_58;
        pMVar21->dims = iStack_50;
        pMVar21->w = iStack_4c;
        pMVar21->h = iStack_48;
        pMVar21->d = iStack_44;
        pMVar21->c = local_40;
        pMVar21->cstep = (size_t)local_38;
      }
      if (piVar16 != (int *)0x0) {
        LOCK();
        *piVar16 = *piVar16 + -1;
        UNLOCK();
        if (*piVar16 == 0) {
          if (local_58 == (Allocator *)0x0) {
            free(local_78);
          }
          else {
            (*local_58->_vptr_Allocator[3])();
          }
        }
      }
      goto LAB_00168ee0;
    }
    piVar16 = (int *)CONCAT44(uStack_6c,uStack_70);
    if (piVar16 != (int *)0x0) {
      LOCK();
      *piVar16 = *piVar16 + -1;
      UNLOCK();
      if (*piVar16 == 0) {
        if (local_58 == (Allocator *)0x0) {
          free(local_78);
        }
        else {
          (*local_58->_vptr_Allocator[3])();
        }
      }
    }
LAB_00168d04:
    bVar24 = false;
  }
  piVar16 = (int *)CONCAT44(local_c8._12_4_,local_c8._8_4_);
  if (piVar16 != (int *)0x0) {
    LOCK();
    *piVar16 = *piVar16 + -1;
    UNLOCK();
    if (*piVar16 == 0) {
      if ((Allocator *)local_c8._32_8_ == (Allocator *)0x0) {
        free((void *)local_c8._0_8_);
      }
      else {
        (*(*(_func_int ***)local_c8._32_8_)[3])();
      }
    }
  }
LAB_00168f65:
  if (bVar24) {
    iVar15 = 0;
  }
  return iVar15;
}

Assistant:

int NetPrivate::do_forward_layer(const Layer* layer, std::vector<Mat>& blob_mats, const Option& opt) const
{
    if (layer->one_blob_only)
    {
        int bottom_blob_index = layer->bottoms[0];
        int top_blob_index = layer->tops[0];

        Mat& bottom_blob_ref = blob_mats[bottom_blob_index];
        Mat bottom_blob;

        if (opt.lightmode)
        {
            // deep copy for inplace forward if data is shared
            if (layer->support_inplace && *bottom_blob_ref.refcount != 1)
            {
                bottom_blob = bottom_blob_ref.clone(opt.blob_allocator);
            }
        }
        if (bottom_blob.dims == 0)
        {
            bottom_blob = bottom_blob_ref;
        }

        convert_layout(bottom_blob, layer, opt);

        // forward
        if (opt.lightmode && layer->support_inplace)
        {
            Mat& bottom_top_blob = bottom_blob;
            int ret = layer->forward_inplace(bottom_top_blob, opt);
            if (ret != 0)
                return ret;

            // store top blob
            blob_mats[top_blob_index] = bottom_top_blob;
        }
        else
        {
            Mat top_blob;
            int ret = layer->forward(bottom_blob, top_blob, opt);
            if (ret != 0)
                return ret;

            // store top blob
            blob_mats[top_blob_index] = top_blob;
        }

        if (opt.lightmode)
        {
            // delete after taken in light mode
            blob_mats[bottom_blob_index].release();
        }
    }
    else
    {
        std::vector<Mat> bottom_blobs(layer->bottoms.size());
        for (size_t i = 0; i < layer->bottoms.size(); i++)
        {
            int bottom_blob_index = layer->bottoms[i];

            Mat& bottom_blob_ref = blob_mats[bottom_blob_index];
            bottom_blobs[i].release();

            if (opt.lightmode)
            {
                // deep copy for inplace forward if data is shared
                if (layer->support_inplace && *bottom_blob_ref.refcount != 1)
                {
                    bottom_blobs[i] = bottom_blob_ref.clone(opt.blob_allocator);
                }
            }
            if (bottom_blobs[i].dims == 0)
            {
                bottom_blobs[i] = bottom_blob_ref;
            }

            convert_layout(bottom_blobs[i], layer, opt);
        }

        // forward
        if (opt.lightmode && layer->support_inplace)
        {
            std::vector<Mat>& bottom_top_blobs = bottom_blobs;
            int ret = layer->forward_inplace(bottom_top_blobs, opt);
            if (ret != 0)
                return ret;

            // store top blobs
            for (size_t i = 0; i < layer->tops.size(); i++)
            {
                int top_blob_index = layer->tops[i];

                blob_mats[top_blob_index] = bottom_top_blobs[i];
            }
        }
        else
        {
            std::vector<Mat> top_blobs(layer->tops.size());
            int ret = layer->forward(bottom_blobs, top_blobs, opt);
            if (ret != 0)
                return ret;

            // store top blobs
            for (size_t i = 0; i < layer->tops.size(); i++)
            {
                int top_blob_index = layer->tops[i];

                blob_mats[top_blob_index] = top_blobs[i];
            }
        }

        if (opt.lightmode)
        {
            for (size_t i = 0; i < layer->bottoms.size(); i++)
            {
                int bottom_blob_index = layer->bottoms[i];

                // delete after taken in light mode
                blob_mats[bottom_blob_index].release();
            }
        }
    }

    return 0;
}